

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopt.c
# Opt level: O3

int gopt(char **argv,option *options)

{
  char cVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t __n;
  option *poVar5;
  size_t sVar6;
  uint uVar7;
  char **ppcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  uint local_54;
  int local_50;
  uint local_4c;
  
  poVar5 = options;
  if ((options->flags & 0x100) == 0) {
    uVar7 = 1;
    do {
      poVar5->argument = (char *)0x0;
      poVar5->count = 0;
      poVar5 = options + uVar7;
      uVar15 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while ((options[uVar15].flags & 0x100) == 0);
  }
  poVar5->short_name = '\0';
  uVar15 = 0;
  poVar5->long_name = (char *)0x0;
  poVar5->argument = (char *)0x0;
  poVar5->count = 0;
  pcVar14 = argv[1];
  if (pcVar14 != (char *)0x0) {
    ppcVar8 = argv + 1;
    local_54 = 1;
    uVar13 = 1;
    uVar7 = 0;
    bVar2 = false;
LAB_00102ac5:
    bVar2 = !bVar2;
    uVar9 = uVar7;
    while (bVar2) {
      if (uVar9 != 0) {
        if ((*pcVar14 == '-') && (pcVar14[1] != '\0')) {
          if ((options[uVar15].flags & 4) != 0) {
            options[uVar15].flags = options[uVar15].flags | uVar9 >> 1;
            options[uVar15].argument = (char *)0x0;
            pcVar14 = *ppcVar8;
            goto LAB_00102b1c;
          }
        }
        options[uVar15].flags = options[uVar15].flags | uVar9;
        options[uVar15].argument = pcVar14;
LAB_00102d6e:
        bVar2 = false;
        uVar7 = 0;
        goto LAB_00102d72;
      }
LAB_00102b1c:
      if (*pcVar14 != '-') {
LAB_00102c60:
        argv[local_54] = pcVar14;
        local_54 = local_54 + 1;
        goto LAB_00102d6e;
      }
      cVar1 = pcVar14[1];
      if (cVar1 != '-') {
        if (cVar1 == '\0') goto LAB_00102c60;
        uVar7 = 0;
        uVar10 = 1;
        goto LAB_00102c96;
      }
      if (pcVar14[2] == '\0') {
        uVar7 = 0;
        goto LAB_00102d4a;
      }
      pcVar14 = pcVar14 + 2;
      pcVar4 = strchr(pcVar14,0x3d);
      __n = strcspn(pcVar14,"=");
      uVar15 = 0;
      if ((options->flags & 0x100) == 0) {
        local_50 = 0;
        uVar15 = 0;
        poVar5 = options;
        do {
          __s = poVar5->long_name;
          if (((__s != (char *)0x0) && (sVar6 = strlen(__s), __n <= sVar6)) &&
             (iVar3 = strncasecmp(__s,pcVar14,__n), iVar3 == 0)) {
            if (__n == sVar6) goto LAB_00102be7;
            local_50 = local_50 + 1;
            local_4c = (uint)uVar15;
          }
          uVar15 = (ulong)((uint)uVar15 + 1);
          poVar5 = options + uVar15;
        } while ((options[uVar15].flags & 0x100) == 0);
        if (local_50 == 1) {
          uVar15 = (ulong)local_4c;
        }
      }
LAB_00102be7:
      options[uVar15].count = options[uVar15].count + 1;
      uVar7 = options[uVar15].flags;
      if (((uVar7 >> 8 & 1) != 0) && (options[uVar15].long_name == (char *)0x0)) {
        options[uVar15].long_name = pcVar14;
      }
      if (pcVar4 != (char *)0x0) {
        options[uVar15].argument = pcVar4 + 1;
        uVar7 = uVar7 | 0x80;
LAB_00102d6b:
        options[uVar15].flags = uVar7;
        goto LAB_00102d6e;
      }
      if ((uVar7 & 2) == 0) {
        options[uVar15].argument = (char *)0x0;
        uVar7 = uVar7 | 0x40;
        goto LAB_00102d6b;
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      ppcVar8 = argv + uVar13;
      pcVar14 = *ppcVar8;
      bVar2 = true;
      uVar9 = 0x80;
      uVar7 = 0x80;
      if (pcVar14 == (char *)0x0) goto LAB_00102dca;
    }
    argv[local_54] = pcVar14;
    local_54 = local_54 + 1;
    uVar7 = uVar9;
LAB_00102d4a:
    bVar2 = true;
    goto LAB_00102d72;
  }
  local_54 = 1;
LAB_00102de1:
  argv[local_54] = (char *)0x0;
  return local_54;
  while( true ) {
    if ((uVar9 & 1) == 0) {
      uVar10 = (ulong)(iVar3 + 1);
      if (pcVar14[uVar10] != '\0') goto LAB_00102d9d;
      if ((uVar9 & 2) == 0) {
        poVar5->argument = (char *)0x0;
        poVar5->flags = uVar9 | 0x10;
      }
      else {
        uVar7 = 0x20;
      }
    }
    else {
      poVar5->argument = (char *)0x0;
      poVar5->flags = uVar9 | 0x10;
      uVar10 = (ulong)(iVar3 + 1);
    }
    pcVar14 = *ppcVar8;
    cVar1 = pcVar14[uVar10];
    if (cVar1 == '\0') break;
LAB_00102c96:
    uVar9 = options->flags;
    if ((uVar9 >> 8 & 1) == 0) {
      uVar15 = 0;
      if (options->short_name != cVar1) {
        uVar12 = 1;
        do {
          uVar15 = (ulong)uVar12;
          uVar9 = options[uVar12].flags;
          if ((uVar9 >> 8 & 1) != 0) break;
          uVar11 = (ulong)uVar12;
          uVar12 = uVar12 + 1;
        } while (options[uVar11].short_name != cVar1);
      }
    }
    else {
      uVar15 = 0;
    }
    poVar5 = options + uVar15;
    options[uVar15].count = options[uVar15].count + 1;
    iVar3 = (int)uVar10;
    if ((uVar9 >> 8 & 1) != 0) {
      if (poVar5->short_name == '\0') {
        poVar5->short_name = pcVar14[uVar10];
      }
      uVar10 = (ulong)(iVar3 + 1);
      if (pcVar14[uVar10] == '\0') {
        poVar5->argument = (char *)0x0;
        uVar9 = uVar9 | 0x10;
      }
      else {
LAB_00102d9d:
        poVar5->argument = pcVar14 + uVar10;
        uVar9 = uVar9 | 0x20;
      }
      poVar5->flags = uVar9;
      break;
    }
  }
  bVar2 = false;
LAB_00102d72:
  uVar13 = (ulong)((int)uVar13 + 1);
  ppcVar8 = argv + uVar13;
  pcVar14 = *ppcVar8;
  if (pcVar14 == (char *)0x0) goto LAB_00102dc6;
  goto LAB_00102ac5;
LAB_00102dc6:
  if (uVar7 != 0) {
LAB_00102dca:
    options[uVar15].flags = options[uVar15].flags | uVar7 >> 1;
    options[uVar15].argument = (char *)0x0;
  }
  goto LAB_00102de1;
}

Assistant:

int gopt (char **argv, struct option *options)
{
  unsigned int operand_count = 1;
  unsigned int doubledash    = 0;
  unsigned int expecting     = 0;
  unsigned int option_index  = 0;
  unsigned int i, j;

  for (i = 0; !(options[i].flags & GOPT_LAST); i++)
  {
    options[i].argument = NULL;
    options[i].count    = 0;
  }

  options[i].short_name = 0;
  options[i].long_name  = NULL;
  options[i].argument   = NULL;
  options[i].count      = 0;

  for (i = 1; argv[i]; i++)
  {
    if (doubledash)
    {
      argv[operand_count] = argv[i];
      operand_count++;
      continue;
    }

    if (expecting)
    {
      if ((argv[i][0] != '-') || !argv[i][1] || !(options[option_index].flags & GOPT_ARGUMENT_NO_HYPHEN))
      {
        options[option_index].flags    |= expecting;
        options[option_index].argument  = argv[i];
        expecting = 0;
        continue;
      }
      else
      {
        options[option_index].flags    |= (expecting >> 1); /* change _WITH to _WITHOUT */
        options[option_index].argument  =  NULL;
        expecting = 0;
      }
    }

    if ((argv[i][0] == '-') && (argv[i][1] == '-') && (argv[i][2] == 0))
    {
      doubledash = 1;
      continue;
    }

    if ((argv[i][0] == '-') && (argv[i][1] == '-'))
    {
      char *eq = strchr (&argv[i][2], '=');

      option_index = long_option_get_index (&argv[i][2], options);

      options[option_index].count++;

      if ((options[option_index].flags & GOPT_LAST) && !options[option_index].long_name)
      {
        options[option_index].long_name = &argv[i][2];
      }

      if (eq)
      {
        options[option_index].argument  = (eq + 1);
        options[option_index].flags    |= GOPT_SEEN_LONG_WITH;
      }
      else if (options[option_index].flags & GOPT_ARGUMENT_REQUIRED)
      {
        expecting = GOPT_SEEN_LONG_WITH;
      }
      else
      {
        options[option_index].argument  = NULL;
        options[option_index].flags    |= GOPT_SEEN_LONG_WITHOUT;
      }
    }
    else if ((argv[i][0] == '-') && argv[i][1])
    {
      for (j = 1; argv[i][j]; j++)
      {
        option_index = short_option_get_index (argv[i][j], options);

        options[option_index].count++;

        if (options[option_index].flags & GOPT_LAST)
        {
          if (!options[option_index].short_name)
          {
            options[option_index].short_name = argv[i][j];
          }

          if (argv[i][j+1])
          {
            options[option_index].argument  = &argv[i][j+1];
            options[option_index].flags    |= GOPT_SEEN_SHORT_WITH;
          }
          else
          {
            options[option_index].argument  = NULL;
            options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
          }
          break;
        }

        if (options[option_index].flags & GOPT_ARGUMENT_FORBIDDEN)
        {
          options[option_index].argument  = NULL;
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
        }

        else if (argv[i][j+1])
        {
          options[option_index].argument  = &argv[i][j+1];
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITH;
          break;
        }

        else if (options[option_index].flags & GOPT_ARGUMENT_REQUIRED)
        {
          expecting = GOPT_SEEN_SHORT_WITH;
        }

        else
        {
          options[option_index].argument  = NULL;
          options[option_index].flags    |= GOPT_SEEN_SHORT_WITHOUT;
        }
      }
    }
    else
    {
      argv[operand_count] = argv[i];
      operand_count++;
    }
  }

  if (expecting)
  {
    options[option_index].flags    |= (expecting >> 1); /* change _WITH to _WITHOUT */
    options[option_index].argument  =  NULL;
  }

  argv[operand_count] = NULL;
  return operand_count;
}